

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O2

int Psr_ManReadSignalList(Psr_Man_t *p,Vec_Int_t *vTemp,char LastSymb,int fAddForm)

{
  char cVar1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  char *pError;
  
  vTemp->nSize = 0;
  do {
    iVar2 = Psr_ManReadSignal(p);
    if (iVar2 == 0) {
      pError = "Cannot read signal in the list.";
      iVar2 = extraout_EDX;
LAB_002e4e8e:
      Psr_ManErrorSet(p,pError,iVar2);
      return 0;
    }
    if (fAddForm != 0) {
      Vec_IntPush(vTemp,0);
    }
    Vec_IntPush(vTemp,iVar2);
    cVar1 = *p->pCur;
    if (cVar1 == LastSymb) {
      return 1;
    }
    if (cVar1 != ',') {
      pError = "Expecting comma in the list.";
      iVar2 = extraout_EDX_00;
      goto LAB_002e4e8e;
    }
    p->pCur = p->pCur + 1;
  } while( true );
}

Assistant:

int Psr_ManReadSignalList( Psr_Man_t * p, Vec_Int_t * vTemp, char LastSymb, int fAddForm )
{
    Vec_IntClear( vTemp );
    while ( 1 )
    {
        int Item = Psr_ManReadSignal(p);
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Cannot read signal in the list.", 0);
        if ( fAddForm )
            Vec_IntPush( vTemp, 0 );
        Vec_IntPush( vTemp, Item );
        if ( Psr_ManIsChar(p, LastSymb) )   break;
        if ( !Psr_ManIsChar(p, ',') )       return Psr_ManErrorSet(p, "Expecting comma in the list.", 0);
        p->pCur++;
    }
    return 1;
}